

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
operator()(LineSegmentsRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ImVec2 IVar6;
  int iVar7;
  ImU32 IVar8;
  uint uVar9;
  GetterYs<int> *pGVar10;
  TransformerLogLog *pTVar11;
  ImPlotPlot *pIVar12;
  GetterYRef *pGVar13;
  ImDrawVert *pIVar14;
  ImDrawIdx *pIVar15;
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  ImDrawIdx IVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  pIVar16 = GImPlot;
  pGVar10 = this->Getter1;
  pTVar11 = this->Transformer;
  iVar7 = pGVar10->Count;
  iVar7 = *(int *)((long)pGVar10->Ys +
                  (long)(((prim + pGVar10->Offset) % iVar7 + iVar7) % iVar7) * (long)pGVar10->Stride
                  );
  dVar23 = log10((pGVar10->XScale * (double)prim + pGVar10->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar16->LogDenX;
  pIVar12 = pIVar16->CurrentPlot;
  dVar3 = (pIVar12->XAxis).Range.Min;
  dVar4 = (pIVar12->XAxis).Range.Max;
  dVar24 = log10((double)iVar7 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar7 = pTVar11->YAxis;
  pIVar12 = pIVar16->CurrentPlot;
  dVar5 = pIVar12->YAxis[iVar7].Range.Min;
  fVar25 = (float)((((double)(float)(dVar23 / dVar2) * (dVar4 - dVar3) + dVar3) -
                   (pIVar12->XAxis).Range.Min) * pIVar16->Mx +
                  (double)pIVar16->PixelRange[iVar7].Min.x);
  fVar20 = (float)((((double)(float)(dVar24 / pIVar16->LogDenY[iVar7]) *
                     (pIVar12->YAxis[iVar7].Range.Max - dVar5) + dVar5) - dVar5) *
                   pIVar16->My[iVar7] + (double)pIVar16->PixelRange[iVar7].Min.y);
  pGVar13 = this->Getter2;
  pTVar11 = this->Transformer;
  dVar2 = pGVar13->YRef;
  dVar23 = log10(((double)prim * pGVar13->XScale + pGVar13->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar17->LogDenX;
  pIVar12 = pIVar17->CurrentPlot;
  dVar4 = (pIVar12->XAxis).Range.Min;
  dVar5 = (pIVar12->XAxis).Range.Max;
  dVar24 = log10(dVar2 / pIVar12->YAxis[pTVar11->YAxis].Range.Min);
  iVar7 = pTVar11->YAxis;
  pIVar12 = pIVar17->CurrentPlot;
  dVar2 = pIVar12->YAxis[iVar7].Range.Min;
  fVar26 = (float)((((double)(float)(dVar23 / dVar3) * (dVar5 - dVar4) + dVar4) -
                   (pIVar12->XAxis).Range.Min) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar7].Min.x);
  fVar27 = (float)((((double)(float)(dVar24 / pIVar17->LogDenY[iVar7]) *
                     (pIVar12->YAxis[iVar7].Range.Max - dVar2) + dVar2) - dVar2) *
                   pIVar17->My[iVar7] + (double)pIVar17->PixelRange[iVar7].Min.y);
  fVar21 = fVar20;
  if (fVar27 <= fVar20) {
    fVar21 = fVar27;
  }
  bVar19 = false;
  if ((fVar21 < (cull_rect->Max).y) &&
     (fVar21 = (float)(~-(uint)(fVar27 <= fVar20) & (uint)fVar27 |
                      -(uint)(fVar27 <= fVar20) & (uint)fVar20), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar21 && fVar21 != *pfVar1)) {
    fVar21 = fVar25;
    if (fVar26 <= fVar25) {
      fVar21 = fVar26;
    }
    bVar19 = false;
    if (fVar21 < (cull_rect->Max).x) {
      fVar21 = (float)(~-(uint)(fVar26 <= fVar25) & (uint)fVar26 |
                      -(uint)(fVar26 <= fVar25) & (uint)fVar25);
      bVar19 = (cull_rect->Min).x <= fVar21 && fVar21 != (cull_rect->Min).x;
    }
  }
  if (bVar19 != false) {
    fVar21 = this->Weight;
    IVar8 = this->Col;
    IVar6 = *uv;
    fVar28 = fVar26 - fVar25;
    fVar29 = fVar27 - fVar20;
    fVar22 = fVar28 * fVar28 + fVar29 * fVar29;
    if (0.0 < fVar22) {
      if (fVar22 < 0.0) {
        fVar22 = sqrtf(fVar22);
      }
      else {
        fVar22 = SQRT(fVar22);
      }
      fVar28 = fVar28 * (1.0 / fVar22);
      fVar29 = fVar29 * (1.0 / fVar22);
    }
    fVar21 = fVar21 * 0.5;
    fVar28 = fVar28 * fVar21;
    fVar21 = fVar21 * fVar29;
    pIVar14 = DrawList->_VtxWritePtr;
    (pIVar14->pos).x = fVar21 + fVar25;
    (pIVar14->pos).y = fVar20 - fVar28;
    pIVar14->uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14->col = IVar8;
    pIVar14[1].pos.x = fVar21 + fVar26;
    pIVar14[1].pos.y = fVar27 - fVar28;
    pIVar14[1].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[1].col = IVar8;
    pIVar14[2].pos.x = fVar26 - fVar21;
    pIVar14[2].pos.y = fVar28 + fVar27;
    pIVar14[2].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[2].col = IVar8;
    pIVar14[3].pos.x = fVar25 - fVar21;
    pIVar14[3].pos.y = fVar28 + fVar20;
    pIVar14[3].uv = IVar6;
    pIVar14 = DrawList->_VtxWritePtr;
    pIVar14[3].col = IVar8;
    DrawList->_VtxWritePtr = pIVar14 + 4;
    uVar9 = DrawList->_VtxCurrentIdx;
    pIVar15 = DrawList->_IdxWritePtr;
    IVar18 = (ImDrawIdx)uVar9;
    *pIVar15 = IVar18;
    pIVar15[1] = IVar18 + 1;
    pIVar15[2] = IVar18 + 2;
    pIVar15[3] = IVar18;
    pIVar15[4] = IVar18 + 2;
    pIVar15[5] = IVar18 + 3;
    DrawList->_IdxWritePtr = pIVar15 + 6;
    DrawList->_VtxCurrentIdx = uVar9 + 4;
  }
  return bVar19;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }